

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::Simulator::eval(Simulator *this)

{
  UserException *this_00;
  _Elt_pointer ppVar1;
  string local_40;
  
  this->simulation_depth_ = 0;
  ppVar1 = (this->event_queue_).c.
           super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->event_queue_).c.
      super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1) {
    do {
      if (*(int *)((long)&this->simulation_depth_ + 4) != 0) {
        this_00 = (UserException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Simulation doesn\'t converge","");
        UserException::UserException(this_00,&local_40);
        __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      deque<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
      ::pop_front(&(this->event_queue_).c);
      process_stmt(this,ppVar1->second,ppVar1->first);
      ppVar1 = (this->event_queue_).c.
               super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->event_queue_).c.
             super__Deque_base<std::pair<const_kratos::Var_*,_kratos::Stmt_*>,_std::allocator<std::pair<const_kratos::Var_*,_kratos::Stmt_*>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar1);
  }
  std::
  _Hashtable<kratos::Stmt_*,_kratos::Stmt_*,_std::allocator<kratos::Stmt_*>,_std::__detail::_Identity,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::clear(&(this->scope_)._M_h);
  return;
}

Assistant:

void Simulator::eval() {
    simulation_depth_ = 0;
    while (!event_queue_.empty()) {
        if (simulation_depth_ > MAX_SIMULATION_DEPTH) {
            throw UserException("Simulation doesn't converge");
        }
        auto &[var, stmt] = event_queue_.front();
        event_queue_.pop();
        process_stmt(stmt, var);
    }
    scope_.clear();
}